

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBMX055.cpp
# Opt level: O1

bool __thiscall RTIMUBMX055::IMURead(RTIMUBMX055 *this)

{
  RTFLOAT RVar1;
  RTFLOAT RVar2;
  bool bVar3;
  uint64_t uVar4;
  uchar status;
  uchar magData [8];
  uchar accelData [6];
  uchar gyroData [6];
  float mz;
  float my;
  float mx;
  uchar local_41;
  byte local_40 [8];
  byte local_38 [2];
  byte local_36;
  byte local_34;
  uchar local_32 [6];
  RTFLOAT local_2c;
  RTFLOAT local_28;
  RTFLOAT local_24;
  
  bVar3 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_gyroSlaveAddr,
                            '\x0e','\x01',&local_41,"Failed to read BMX055 gyro fifo status");
  if (bVar3) {
    if ((char)local_41 < '\0') {
      IMURead();
      goto LAB_0011daaa;
    }
    if (local_41 != '\0') {
      bVar3 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                this->m_gyroSlaveAddr,'?','\x06',local_32,
                                "Failed to read BMX055 gyro data");
      if (bVar3) {
        bVar3 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_accelSlaveAddr,'\x02','\x06',local_38,
                                  "Failed to read BMX055 accel data");
        if (bVar3) {
          bVar3 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                    this->m_magSlaveAddr,'B','\b',local_40,
                                    "Failed to read BMX055 mag data");
          if (bVar3) {
            RTMath::convertToVector
                      (local_32,&(this->super_RTIMU).m_imuData.gyro,this->m_gyroScale,false);
            local_38[0] = local_38[0] & 0xf0;
            local_36 = local_36 & 0xf0;
            local_34 = local_34 & 0xf0;
            RTMath::convertToVector
                      (local_38,&(this->super_RTIMU).m_imuData.accel,this->m_accelScale,false);
            processMagData(this,local_40,&local_24,&local_28,&local_2c);
            (this->super_RTIMU).m_imuData.compass.m_data[0] = local_24;
            (this->super_RTIMU).m_imuData.compass.m_data[1] = local_28;
            RVar1 = (this->super_RTIMU).m_imuData.gyro.m_data[2];
            RVar2 = (this->super_RTIMU).m_imuData.accel.m_data[0];
            (this->super_RTIMU).m_imuData.gyro.m_data[1] =
                 -(this->super_RTIMU).m_imuData.gyro.m_data[1];
            (this->super_RTIMU).m_imuData.gyro.m_data[2] = -RVar1;
            (this->super_RTIMU).m_imuData.accel.m_data[0] = -RVar2;
            (this->super_RTIMU).m_imuData.compass.m_data[0] = -local_28;
            (this->super_RTIMU).m_imuData.compass.m_data[1] = -local_24;
            (this->super_RTIMU).m_imuData.compass.m_data[2] = -local_2c;
            RTIMU::handleGyroBias(&this->super_RTIMU);
            RTIMU::calibrateAverageCompass(&this->super_RTIMU);
            RTIMU::calibrateAccel(&this->super_RTIMU);
            if (this->m_firstTime == true) {
              uVar4 = RTMath::currentUSecsSinceEpoch();
            }
            else {
              uVar4 = (this->super_RTIMU).m_imuData.timestamp + (this->super_RTIMU).m_sampleInterval
              ;
            }
            (this->super_RTIMU).m_imuData.timestamp = uVar4;
            this->m_firstTime = false;
            RTIMU::updateFusion(&this->super_RTIMU);
            local_40[0] = 1;
            goto LAB_0011daaa;
          }
        }
      }
    }
  }
  local_40[0] = 0;
LAB_0011daaa:
  return (bool)(local_40[0] & 1);
}

Assistant:

bool RTIMUBMX055::IMURead()
{
    unsigned char status;
    unsigned char gyroData[6];
    unsigned char accelData[6];
    unsigned char magData[8];

    if (!m_settings->HALRead(m_gyroSlaveAddr, BMX055_GYRO_FIFO_STATUS, 1, &status, "Failed to read BMX055 gyro fifo status"))
        return false;

    if (status & 0x80) {
        // fifo overflowed
        HAL_ERROR("BMX055 fifo overflow\n");

        // this should clear it
        if (!m_settings->HALWrite(m_gyroSlaveAddr, BMX055_GYRO_FIFO_CONFIG_1, 0x40, "Failed to set BMX055 FIFO config"))
            return false;

        m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();  // try to fix timestamp
        return false;
    }

    if (status == 0)
        return false;

    if (!m_settings->HALRead(m_gyroSlaveAddr, BMX055_GYRO_FIFO_DATA, 6, gyroData, "Failed to read BMX055 gyro data"))
            return false;

    if (!m_settings->HALRead(m_accelSlaveAddr, BMX055_ACCEL_X_LSB, 6, accelData, "Failed to read BMX055 accel data"))
        return false;

    if (!m_settings->HALRead(m_magSlaveAddr, BMX055_MAG_X_LSB, 8, magData, "Failed to read BMX055 mag data"))
        return false;

    RTMath::convertToVector(gyroData, m_imuData.gyro, m_gyroScale, false);

    //  need to prepare accel data

    accelData[0] &= 0xf0;
    accelData[2] &= 0xf0;
    accelData[4] &= 0xf0;

    RTMath::convertToVector(accelData, m_imuData.accel, m_accelScale, false);

    float mx, my, mz;

    processMagData(magData, mx, my, mz);
    m_imuData.compass.setX(mx);
    m_imuData.compass.setY(my);
    m_imuData.compass.setZ(mz);

    //  sort out gyro axes

    m_imuData.gyro.setY(-m_imuData.gyro.y());
    m_imuData.gyro.setZ(-m_imuData.gyro.z());

    //  sort out accel axes

    m_imuData.accel.setX(-m_imuData.accel.x());

    //  sort out mag axes

#ifdef BMX055_REMAP
    m_imuData.compass.setY(-m_imuData.compass.y());
    m_imuData.compass.setZ(-m_imuData.compass.z());
#else
    RTFLOAT temp =  m_imuData.compass.x();
    m_imuData.compass.setX(-m_imuData.compass.y());
    m_imuData.compass.setY(-temp);
    m_imuData.compass.setZ(-m_imuData.compass.z());
#endif
    //  now do standard processing

    handleGyroBias();
    calibrateAverageCompass();
    calibrateAccel();

    if (m_firstTime)
        m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();
    else
        m_imuData.timestamp += m_sampleInterval;

    m_firstTime = false;

    //  now update the filter

    updateFusion();

    return true;
}